

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O1

bool __thiscall
glslang::TIntermediate::canImplicitlyPromote
          (TIntermediate *this,TBasicType from,TBasicType to,TOperator op)

{
  EProfile EVar1;
  int iVar2;
  EShSource EVar3;
  bool bVar4;
  bool bVar5;
  
  EVar1 = this->profile;
  iVar2 = this->version;
  if (iVar2 == 0x6e || iVar2 < 0x136 && EVar1 == EEsProfile) goto switchD_00413479_caseD_4;
  if (from == to) {
    return true;
  }
  EVar3 = this->source;
  bVar5 = EVar3 == EShSourceHlsl;
  if (bVar5) {
    if (((from < EbtAtomicUint) && ((0xcf9U >> ((byte)from & 0x1f) & 1) == 0)) &&
       ((to < EbtAtomicUint && ((0xcf9U >> ((byte)to & 0x1f) & 1) == 0)))) {
      if ((op - EOpConstructStruct < 0x16) &&
         ((0x3ede01U >> (op - EOpConstructStruct & 0x1f) & 1) != 0)) {
        return true;
      }
      if ((op < EOpIndexDirect) && ((0x7000000000210U >> ((ulong)op & 0x3f) & 1) != 0)) {
        return true;
      }
      if (op == EOpReturn) {
        return true;
      }
    }
    if (((from == EbtBool) && (to < EbtInt64)) &&
       ((0x302U >> (to & (EbtNumTypes|EbtFloat16)) & 1) != 0)) {
      return true;
    }
  }
  else {
    if (((((from & ~EbtFloat16) == EbtInt8 && to == EbtInt) ||
         ((from - EbtFloat & 0xfffffffd) == 0 && to == EbtDouble)) ||
        (bVar4 = isIntegralConversion(this,from,to), bVar4)) ||
       (from == EbtFloat16 && to == EbtFloat)) goto LAB_004133a9;
    if (from < EbtBool) {
      if ((0xf0U >> (from & (EbtNumTypes|EbtFloat16)) & 1) == 0) {
        if ((0x300U >> (from & (EbtNumTypes|EbtFloat16)) & 1) == 0) {
          if (((0xc00U >> (from & (EbtNumTypes|EbtFloat16)) & 1) != 0) && (to == EbtDouble)) {
LAB_004133a9:
            if ((char)(this->numericFeatures).features != '\0') {
              return true;
            }
          }
        }
        else if (to - EbtFloat < 2) goto LAB_004133a9;
      }
      else if (to - EbtFloat < 3) goto LAB_004133a9;
    }
  }
  if (EVar1 == EEsProfile) {
    if (to != EbtUint) {
      if (to != EbtFloat) goto switchD_00413479_caseD_4;
      from = from & ~EbtFloat;
    }
    if (from == EbtInt) {
      return (bool)(*(byte *)((long)&(this->numericFeatures).features + 1) & 1);
    }
    goto switchD_00413479_caseD_4;
  }
  switch(to) {
  case EbtFloat:
    switch(from) {
    case EbtFloat16:
      return (bool)((*(byte *)((long)&(this->numericFeatures).features + 1) & 8) >> 3 |
                   EVar3 == EShSourceHlsl);
    case EbtInt16:
    case EbtUint16:
      goto switchD_00413479_caseD_6;
    case EbtInt:
    case EbtUint:
      return true;
    case EbtBool:
      return bVar5;
    }
    break;
  case EbtDouble:
    if (EbtUint64 < from) {
      return false;
    }
    if ((0xf02U >> (from & (EbtNumTypes|EbtFloat16)) & 1) != 0) {
      if (iVar2 < 400) {
        return (bool)((*(byte *)((long)&(this->numericFeatures).features + 1) & 2) >> 1);
      }
      return true;
    }
    if ((0xc0U >> (from & (EbtNumTypes|EbtFloat16)) & 1) == 0) {
      if (from != EbtFloat16) {
        return false;
      }
      if ((399 < iVar2) || (((this->numericFeatures).features & 0x200) != 0)) {
        return (bool)((*(byte *)((long)&(this->numericFeatures).features + 1) & 8) >> 3);
      }
    }
    else if ((399 < iVar2) || (((this->numericFeatures).features & 0x200) != 0))
    goto switchD_00413479_caseD_6;
    break;
  case EbtFloat16:
    from = from & ~EbtFloat;
  case EbtUint16:
switchD_00413459_caseD_7:
    if (from == EbtInt16) {
switchD_00413479_caseD_6:
      return (bool)((*(byte *)((long)&(this->numericFeatures).features + 1) & 4) >> 2);
    }
    break;
  default:
    goto switchD_00413459_caseD_4;
  case EbtInt:
    if (from == EbtInt16) goto switchD_00413479_caseD_6;
    if (from == EbtBool) {
      return bVar5;
    }
    break;
  case EbtUint:
    if (from - EbtInt16 < 2) goto switchD_00413479_caseD_6;
    if (from == EbtBool) {
      return bVar5;
    }
    if (from == EbtInt) {
      if (iVar2 < 400 && EVar3 != EShSourceHlsl) {
        bVar5 = IsRequestedExtension(this,"GL_ARB_gpu_shader5");
        return bVar5;
      }
      return true;
    }
    break;
  case EbtInt64:
    if (from == EbtInt) {
      return true;
    }
    goto switchD_00413459_caseD_7;
  case EbtUint64:
    if (from - EbtInt < 3) {
      return true;
    }
    if (from - EbtInt16 < 2) goto switchD_00413479_caseD_6;
  }
switchD_00413479_caseD_4:
switchD_00413459_caseD_4:
  return false;
}

Assistant:

bool TIntermediate::canImplicitlyPromote(TBasicType from, TBasicType to, TOperator op) const
{
    if ((isEsProfile() && version < 310 ) || version == 110)
        return false;

    if (from == to)
        return true;

    // TODO: Move more policies into language-specific handlers.
    // Some languages allow more general (or potentially, more specific) conversions under some conditions.
    if (getSource() == EShSourceHlsl) {
        const bool fromConvertable = (from == EbtFloat || from == EbtDouble || from == EbtInt || from == EbtUint || from == EbtBool);
        const bool toConvertable = (to == EbtFloat || to == EbtDouble || to == EbtInt || to == EbtUint || to == EbtBool);

        if (fromConvertable && toConvertable) {
            switch (op) {
            case EOpAndAssign:               // assignments can perform arbitrary conversions
            case EOpInclusiveOrAssign:       // ...
            case EOpExclusiveOrAssign:       // ...
            case EOpAssign:                  // ...
            case EOpAddAssign:               // ...
            case EOpSubAssign:               // ...
            case EOpMulAssign:               // ...
            case EOpVectorTimesScalarAssign: // ...
            case EOpMatrixTimesScalarAssign: // ...
            case EOpDivAssign:               // ...
            case EOpModAssign:               // ...
            case EOpReturn:                  // function returns can also perform arbitrary conversions
            case EOpFunctionCall:            // conversion of a calling parameter
            case EOpLogicalNot:
            case EOpLogicalAnd:
            case EOpLogicalOr:
            case EOpLogicalXor:
            case EOpConstructStruct:
                return true;
            default:
                break;
            }
        }
    }

    if (getSource() == EShSourceHlsl) {
        // HLSL
        if (from == EbtBool && (to == EbtInt || to == EbtUint || to == EbtFloat))
            return true;
    } else {
        // GLSL
        if (isIntegralPromotion(from, to) ||
            isFPPromotion(from, to) ||
            isIntegralConversion(from, to) ||
            isFPConversion(from, to) ||
            isFPIntegralConversion(from, to)) {

            if (numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types) ||
                numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_int8) ||
                numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_int16) ||
                numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_int32) ||
                numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_int64) ||
                numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_float16) ||
                numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_float32) ||
                numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_float64)) {
                return true;
            }
        }
    }

    if (isEsProfile()) {
        switch (to) {
            case EbtFloat:
                switch (from) {
                case EbtInt:
                case EbtUint:
                    return numericFeatures.contains(TNumericFeatures::shader_implicit_conversions);
                default:
                    return false;
                }
            case EbtUint:
                switch (from) {
                case EbtInt:
                    return numericFeatures.contains(TNumericFeatures::shader_implicit_conversions);
                default:
                    return false;
                }
            default:
                return false;
        }        
    } else {
        switch (to) {
        case EbtDouble:
            switch (from) {
            case EbtInt:
            case EbtUint:
            case EbtInt64:
            case EbtUint64:
            case EbtFloat:
                return version >= 400 || numericFeatures.contains(TNumericFeatures::gpu_shader_fp64);
            case EbtInt16:
            case EbtUint16:
                return (version >= 400 || numericFeatures.contains(TNumericFeatures::gpu_shader_fp64)) &&
                                          numericFeatures.contains(TNumericFeatures::gpu_shader_int16);
            case EbtFloat16:
                return (version >= 400 || numericFeatures.contains(TNumericFeatures::gpu_shader_fp64)) &&
                                          numericFeatures.contains(TNumericFeatures::gpu_shader_half_float);
            default:
                return false;
           }
        case EbtFloat:
            switch (from) {
            case EbtInt:
            case EbtUint:
                 return true;
            case EbtBool:
                 return getSource() == EShSourceHlsl;
            case EbtInt16:
            case EbtUint16:
                return numericFeatures.contains(TNumericFeatures::gpu_shader_int16);
            case EbtFloat16:
                return numericFeatures.contains(TNumericFeatures::gpu_shader_half_float) ||
                    getSource() == EShSourceHlsl;
            default:
                 return false;
            }
        case EbtUint:
            switch (from) {
            case EbtInt:
                return version >= 400 || getSource() == EShSourceHlsl || IsRequestedExtension(E_GL_ARB_gpu_shader5);
            case EbtBool:
                return getSource() == EShSourceHlsl;
            case EbtInt16:
            case EbtUint16:
                return numericFeatures.contains(TNumericFeatures::gpu_shader_int16);
            default:
                return false;
            }
        case EbtInt:
            switch (from) {
            case EbtBool:
                return getSource() == EShSourceHlsl;
            case EbtInt16:
                return numericFeatures.contains(TNumericFeatures::gpu_shader_int16);
            default:
                return false;
            }
        case EbtUint64:
            switch (from) {
            case EbtInt:
            case EbtUint:
            case EbtInt64:
                return true;
            case EbtInt16:
            case EbtUint16:
                return numericFeatures.contains(TNumericFeatures::gpu_shader_int16);
            default:
                return false;
            }
        case EbtInt64:
            switch (from) {
            case EbtInt:
                return true;
            case EbtInt16:
                return numericFeatures.contains(TNumericFeatures::gpu_shader_int16);
            default:
                return false;
            }
        case EbtFloat16:
            switch (from) {
            case EbtInt16:
            case EbtUint16:
                return numericFeatures.contains(TNumericFeatures::gpu_shader_int16);
            default:
                break;
            }
            return false;
        case EbtUint16:
            switch (from) {
            case EbtInt16:
                return numericFeatures.contains(TNumericFeatures::gpu_shader_int16);
            default:
                break;
            }
            return false;
        default:
            return false;
        }
    }

    return false;
}